

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::copyAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  qsizetype *pqVar1;
  BasicSelector *pBVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<QCss::BasicSelector>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::BasicSelector>).size;
      pDVar4 = (b->elementName).d.d;
      pBVar2[lVar3].elementName.d.d = pDVar4;
      pBVar2[lVar3].elementName.d.ptr = (b->elementName).d.ptr;
      pBVar2[lVar3].elementName.d.size = (b->elementName).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (b->ids).d.d;
      pBVar2[lVar3].ids.d.d = pDVar5;
      pBVar2[lVar3].ids.d.ptr = (b->ids).d.ptr;
      pBVar2[lVar3].ids.d.size = (b->ids).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (b->pseudos).d.d;
      pBVar2[lVar3].pseudos.d.d = pDVar6;
      pBVar2[lVar3].pseudos.d.ptr = (b->pseudos).d.ptr;
      pBVar2[lVar3].pseudos.d.size = (b->pseudos).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (b->attributeSelectors).d.d;
      pBVar2[lVar3].attributeSelectors.d.d = pDVar7;
      pBVar2[lVar3].attributeSelectors.d.ptr = (b->attributeSelectors).d.ptr;
      pBVar2[lVar3].attributeSelectors.d.size = (b->attributeSelectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar2[lVar3].relationToNext = b->relationToNext;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::BasicSelector>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }